

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O3

CURLMcode singlesocket(Curl_multi *multi,Curl_easy *data)

{
  CURLMcode CVar1;
  easy_pollset cur_poll;
  easy_pollset local_40;
  
  multi_getsock(data,&local_40);
  CVar1 = Curl_multi_pollset_ev(multi,data,&local_40,&data->last_poll);
  if (CVar1 == CURLM_OK) {
    *(undefined8 *)((data->last_poll).sockets + 4) = local_40._16_8_;
    (data->last_poll).actions[0] = local_40.actions[0];
    (data->last_poll).actions[1] = local_40.actions[1];
    (data->last_poll).actions[2] = local_40.actions[2];
    (data->last_poll).actions[3] = local_40.actions[3];
    (data->last_poll).actions[4] = local_40.actions[4];
    *(undefined3 *)&(data->last_poll).field_0x1d = local_40._29_3_;
    *(undefined8 *)(data->last_poll).sockets = local_40.sockets._0_8_;
    *(undefined8 *)((data->last_poll).sockets + 2) = local_40.sockets._8_8_;
  }
  return CVar1;
}

Assistant:

static CURLMcode singlesocket(struct Curl_multi *multi,
                              struct Curl_easy *data)
{
  struct easy_pollset cur_poll;
  CURLMcode mresult;

  /* Fill in the 'current' struct with the state as it is now: what sockets to
     supervise and for what actions */
  multi_getsock(data, &cur_poll);
  mresult = Curl_multi_pollset_ev(multi, data, &cur_poll, &data->last_poll);

  if(!mresult) /* Remember for next time */
    memcpy(&data->last_poll, &cur_poll, sizeof(cur_poll));
  return mresult;
}